

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

Type __thiscall capnp::Schema::BrandArgumentList::operator[](BrandArgumentList *this,uint index)

{
  Binding *pBVar1;
  Initializer *pIVar2;
  ulong uVar3;
  anon_union_8_2_eba6ea51_for_Type_5 aVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Type TVar8;
  
  if (this->isUnbound == true) {
    aVar4 = (anon_union_8_2_eba6ea51_for_Type_5)this->scopeId;
    uVar5 = (ulong)index;
    uVar6 = 0x12;
    uVar3 = 0;
    uVar7 = 0;
    goto LAB_0015a505;
  }
  if (this->size_ <= index) {
    uVar6 = 0x12;
    uVar3 = 0;
    uVar7 = 0;
    uVar5 = 0;
    aVar4.schema = (RawBrandedSchema *)0x0;
    goto LAB_0015a505;
  }
  pBVar1 = this->bindings + index;
  uVar6 = (ulong)this->bindings[index].which;
  if (uVar6 == 0x12) {
    aVar4 = (anon_union_8_2_eba6ea51_for_Type_5)(pBVar1->field_4).schema;
    if (aVar4.schema == (RawBrandedSchema *)0x0) {
      uVar6 = (ulong)pBVar1->paramIndex << 0x20;
      if (pBVar1->isImplicitParameter == true) {
        uVar6 = uVar6 | 0x1000012;
      }
      else {
        uVar6 = uVar6 | 0x12;
      }
LAB_0015a4df:
      aVar4.schema = (RawBrandedSchema *)0x0;
    }
    else {
      uVar6 = (ulong)pBVar1->paramIndex << 0x20 | 0x12;
    }
  }
  else {
    if ((pBVar1->field_4).schema == (RawBrandedSchema *)0x0) goto LAB_0015a4df;
    pIVar2 = ((pBVar1->field_4).schema)->lazyInitializer;
    if (pIVar2 != (Initializer *)0x0) {
      (**pIVar2->_vptr_Initializer)();
    }
    uVar6 = (ulong)pBVar1->which;
    aVar4 = (anon_union_8_2_eba6ea51_for_Type_5)(pBVar1->field_4).schema;
  }
  uVar5 = uVar6 >> 0x20;
  uVar7 = (ulong)((uint)uVar6 & 0xff000000);
  uVar3 = (ulong)((uint)pBVar1->listDepth * 0x10000 + (uint)uVar6 & 0xff0000);
  uVar6 = uVar6 & 0xffff;
LAB_0015a505:
  TVar8._0_8_ = (uVar5 & 0xffff) << 0x20 | uVar6 | uVar3 | uVar7;
  TVar8.field_4.schema = aVar4.schema;
  return TVar8;
}

Assistant:

Type Schema::BrandArgumentList::operator[](uint index) const {
  if (isUnbound) {
    return Type::BrandParameter { scopeId, index };
  }

  if (index >= size_) {
    // Binding index out-of-range. Treat as AnyPointer. This is important to allow new
    // type parameters to be added to existing types without breaking dependent
    // schemas.
    return schema::Type::ANY_POINTER;
  }

  auto& binding = bindings[index];
  Type result;
  if (binding.which == (uint)schema::Type::ANY_POINTER) {
    if (binding.scopeId != 0) {
      result = Type::BrandParameter { binding.scopeId, binding.paramIndex };
    } else if (binding.isImplicitParameter) {
      result = Type::ImplicitParameter { binding.paramIndex };
    } else {
      result = static_cast<schema::Type::AnyPointer::Unconstrained::Which>(binding.paramIndex);
    }
  } else if (binding.schema == nullptr) {
    // Builtin / primitive type.
    result = static_cast<schema::Type::Which>(binding.which);
  } else {
    binding.schema->ensureInitialized();
    result = Type(static_cast<schema::Type::Which>(binding.which), binding.schema);
  }

  return result.wrapInList(binding.listDepth);
}